

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

ufile_error curl_do(CURL *curl)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ufile_error uVar4;
  long response_code;
  long local_10;
  
  iVar1 = curl_easy_perform();
  if (iVar1 == 0) {
    iVar1 = curl_easy_getinfo(curl,0x200002,&local_10);
    if (iVar1 == 0) {
      pcVar3 = "http is not OK, check the code as HTTP code.";
      if (local_10 - 200U < 100) {
        pcVar3 = "";
      }
      pcVar2 = "File not found.";
      if ((int)local_10 != 0x194) {
        pcVar2 = pcVar3;
      }
      goto LAB_001087d9;
    }
    pcVar2 = "Get curl response code failed.";
  }
  else {
    pcVar2 = (char *)curl_easy_strerror(iVar1);
  }
  local_10 = 0xffffffec;
LAB_001087d9:
  uVar4.message = pcVar2;
  uVar4._0_8_ = local_10;
  return uVar4;
}

Assistant:

struct ufile_error
curl_do(CURL *curl){
    struct ufile_error error = NO_ERROR;
    CURLcode curl_code = curl_easy_perform(curl);
    if (curl_code != CURLE_OK) {
        error.code = CURL_ERROR_CODE;
        error.message = curl_easy_strerror(curl_code);
        return error;
    }

    long response_code;
    if (curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code) != CURLE_OK){
        error.code = CURL_ERROR_CODE;
        error.message = "Get curl response code failed.";
        return error;
    }

    if (!HTTP_IS_OK(response_code)){
        error.message = "http is not OK, check the code as HTTP code.";
    }

    error.code = response_code;
    if(error.code == 404){
        error.message = "File not found.";
    }
    return error;
}